

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O2

int32_t rtosc_convert_to_range
                  (rtosc_arg_val_t *arg,size_t size,rtosc_arg_val_t *arg_out,
                  rtosc_print_options *opt)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  long lVar7;
  rtosc_arg_val_t *arg_00;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  rtosc_arg_val_t *local_78;
  rtosc_arg_val_t delta;
  rtosc_arg_val_t added;
  
  if (size < 5) {
    return 0;
  }
  cVar1 = arg->type;
  if (cVar1 == '-') {
    return 0;
  }
  if (opt->compress_ranges == 0) {
    return 0;
  }
  uVar9 = 0;
  for (uVar8 = 0; (uVar8 < size && (cVar1 == arg[uVar8].type)); uVar8 = uVar8 + sVar5) {
    sVar5 = incsize(arg + uVar8);
    uVar9 = uVar9 + 1;
  }
  if (uVar9 < 5) {
    return 0;
  }
  sVar5 = incsize(arg);
  lVar7 = 0;
  iVar3 = rtosc_arg_vals_eq_single(arg,arg + sVar5,(rtosc_cmp_options *)0x0);
  local_78 = arg;
  if (iVar3 == 0) {
    pvVar6 = memchr("cihTF",(int)arg->type,6);
    if (pvVar6 == (void *)0x0) {
      return 0;
    }
    rtosc_arg_val_sub(arg + 1,arg,&delta);
    lVar7 = 1;
    local_78 = &added;
  }
  sVar5 = incsize(arg);
  uVar8 = 1;
  bVar2 = true;
  do {
    iVar4 = (int)sVar5;
    if (!bVar2) {
      if (uVar8 < 5) {
        return 0;
      }
      insert_arg_range(arg_out,(int32_t)uVar8,arg,(int)lVar7,&delta,0,0);
      sVar5 = incsize(arg);
      arg_00 = arg_out + lVar7 + sVar5 + 1;
      arg_00->type = ' ';
      rtosc_av_arr_len_set(arg_00,(int)(((long)arg_00 - (long)arg_out) / -0x18) + iVar4 + -1);
      return iVar4;
    }
    sVar5 = incsize(arg + iVar4);
    if (iVar3 == 0) {
      rtosc_arg_val_add(arg + iVar4,&delta,&added);
    }
    sVar5 = sVar5 + (long)iVar4;
    if (sVar5 < size) {
      iVar4 = rtosc_arg_vals_eq_single(local_78,arg + sVar5,(rtosc_cmp_options *)0x0);
      bVar2 = true;
      if (iVar4 == 0) goto LAB_0010c234;
    }
    else {
LAB_0010c234:
      bVar2 = false;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

static int32_t rtosc_convert_to_range(const rtosc_arg_val_t* const arg,
                                      size_t size,
                                      rtosc_arg_val_t* arg_out,
                                      const rtosc_print_options* opt)
{
    if(size < range_min || arg[0].type == '-' || !opt->compress_ranges)
        return 0;
    char type = arg->type;
    size_t num_common = 0;
    for(size_t i = 0; i < size; i += incsize(arg+i), ++num_common)
    {
        if(type != arg[i].type)
            break;
    }
    if(num_common < range_min)
        return 0;

    int32_t skipped;
    num_common = 1;
    int has_delta;
    rtosc_arg_val_t delta, added;

    if(rtosc_arg_vals_eq_single(arg, arg + incsize(arg), NULL))
        has_delta = 0;
    else if(strchr(numeric_range_convertible_types(), arg->type)) {
        has_delta = 1;
        rtosc_arg_val_sub(arg+1, arg, &delta);
    }
    else return 0;

    {
        int go_on = 1;
        size_t next;
        for(skipped = incsize(arg); go_on; skipped = next, ++num_common)
        {
            next = skipped + incsize(arg+skipped);

            if(has_delta)
                rtosc_arg_val_add(arg+skipped, &delta, &added);

            if(next >= size || !rtosc_arg_vals_eq_single(has_delta ? &added
                                                                   : arg,
                                                         arg+next, NULL))
                go_on = false;
        }
    }

    if(num_common >= range_min)
    {
        insert_arg_range(arg_out, num_common, arg, has_delta, &delta,
                         false, false);
        const rtosc_arg_val_t* old_arg_out = arg_out;
        arg_out += 1 + has_delta;
        arg_out += incsize(arg);
        arg_out->type = ' ';
        rtosc_av_arr_len_set(arg_out, skipped - (arg_out - old_arg_out) - 1);
        return skipped;
    }
    else
        return 0;
}